

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.hpp
# Opt level: O2

string * tf::get_env(string *__return_storage_ptr__,string *str)

{
  char *pcVar1;
  char *__s;
  allocator<char> local_9;
  
  pcVar1 = getenv((str->_M_dataplus)._M_p);
  __s = "";
  if (pcVar1 != (char *)0x0) {
    __s = pcVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

inline std::string get_env(const std::string& str) {
#ifdef _MSC_VER
  char *ptr = nullptr;
  size_t len = 0;

  if(_dupenv_s(&ptr, &len, str.c_str()) == 0 && ptr != nullptr) {
    std::string res(ptr, len);
    std::free(ptr);
    return res;
  }
  return "";

#else
  auto ptr = std::getenv(str.c_str());
  return ptr ? ptr : "";
#endif
}